

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::DatabaseImpl::AddTraffic(DatabaseImpl *this,string *port,string *traffic)

{
  socklen_t in_ECX;
  undefined1 local_a0 [8];
  Statement query;
  time_t result;
  string *traffic_local;
  string *port_local;
  DatabaseImpl *this_local;
  
  query._112_8_ = time((time_t *)0x0);
  SQLite::Statement::Statement
            ((Statement *)local_a0,&this->db_,
             "INSERT INTO traffic VALUES (@port, @result, @traffic)");
  SQLite::Statement::bind((Statement *)local_a0,0x4727d3,(sockaddr *)port,in_ECX);
  SQLite::Statement::bind((Statement *)local_a0,0x47279f,(sockaddr *)query._112_8_,in_ECX);
  SQLite::Statement::bind((Statement *)local_a0,0x4727a7,(sockaddr *)traffic,in_ECX);
  SQLite::Statement::exec((Statement *)local_a0);
  SQLite::Statement::~Statement((Statement *)local_a0);
  return;
}

Assistant:

void Database::DatabaseImpl::AddTraffic(const string& port, const string& traffic)
{
    time_t result = time(nullptr);
    SQLite::Statement query(db_, "INSERT INTO traffic VALUES (@port, @result, @traffic)");
    query.bind("@port", port);
    query.bind("@result", result);
    query.bind("@traffic", traffic);
    query.exec();
}